

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O3

ConversionResult
llvm::ConvertUTF32toUTF16
          (UTF32 **sourceStart,UTF32 *sourceEnd,UTF16 **targetStart,UTF16 *targetEnd,
          ConversionFlags flags)

{
  uint uVar1;
  ConversionResult CVar2;
  UTF16 *pUVar3;
  uint *puVar4;
  
  puVar4 = *sourceStart;
  pUVar3 = *targetStart;
  CVar2 = conversionOK;
  if (puVar4 < sourceEnd) {
    CVar2 = conversionOK;
    do {
      if (targetEnd <= pUVar3) {
LAB_001ab68f:
        CVar2 = targetExhausted;
        break;
      }
      uVar1 = *puVar4;
      if (uVar1 < 0x10000) {
        if ((uVar1 & 0xf800) == 0xd800) {
          if (flags == strictConversion) {
            CVar2 = sourceIllegal;
            break;
          }
LAB_001ab633:
          *pUVar3 = 0xfffd;
        }
        else {
          *pUVar3 = (ushort)uVar1;
        }
        pUVar3 = pUVar3 + 1;
      }
      else if (uVar1 < 0x110000) {
        if (targetEnd <= pUVar3 + 1) goto LAB_001ab68f;
        *pUVar3 = (short)(uVar1 + 0x3ff0000 >> 10) + 0xd800;
        pUVar3[1] = (ushort)uVar1 & 0x3ff | 0xdc00;
        pUVar3 = pUVar3 + 2;
      }
      else {
        if (flags != strictConversion) goto LAB_001ab633;
        CVar2 = sourceIllegal;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 < sourceEnd);
  }
  *sourceStart = puVar4;
  *targetStart = pUVar3;
  return CVar2;
}

Assistant:

ConversionResult ConvertUTF32toUTF16 (
        const UTF32** sourceStart, const UTF32* sourceEnd,
        UTF16** targetStart, UTF16* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF32* source = *sourceStart;
    UTF16* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch;
        if (target >= targetEnd) {
            result = targetExhausted; break;
        }
        ch = *source++;
        if (ch <= UNI_MAX_BMP) { /* Target is a character <= 0xFFFF */
            /* UTF-16 surrogate values are illegal in UTF-32; 0xffff or 0xfffe are both reserved values */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                if (flags == strictConversion) {
                    --source; /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                } else {
                    *target++ = UNI_REPLACEMENT_CHAR;
                }
            } else {
                *target++ = (UTF16)ch; /* normal case */
            }
        } else if (ch > UNI_MAX_LEGAL_UTF32) {
            if (flags == strictConversion) {
                result = sourceIllegal;
            } else {
                *target++ = UNI_REPLACEMENT_CHAR;
            }
        } else {
            /* target is a character in range 0xFFFF - 0x10FFFF. */
            if (target + 1 >= targetEnd) {
                --source; /* Back up source pointer! */
                result = targetExhausted; break;
            }
            ch -= halfBase;
            *target++ = (UTF16)((ch >> halfShift) + UNI_SUR_HIGH_START);
            *target++ = (UTF16)((ch & halfMask) + UNI_SUR_LOW_START);
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}